

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::addImageProcessingQCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  bool bVar1;
  mapped_type *this_00;
  Id local_20;
  Op local_1c;
  Id texid;
  Op opc;
  Decoration decor_local;
  Id id_local;
  TGlslangToSpvTraverser *this_local;
  
  texid = decor;
  opc = id;
  _decor_local = this;
  local_1c = spv::Builder::getOpCode(&this->builder,id);
  if (local_1c == OpSampledImage) {
    opc = spv::Builder::getIdOperand(&this->builder,opc,0);
    local_1c = spv::Builder::getOpCode(&this->builder,opc);
  }
  if (local_1c == OpLoad) {
    local_20 = spv::Builder::getIdOperand(&this->builder,opc,0);
    bVar1 = hasQCOMImageProceessingDecoration(this,local_20,texid);
    if (!bVar1) {
      spv::Builder::addDecoration(&this->builder,local_20,texid,-1);
      this_00 = std::
                unordered_map<unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>_>
                ::operator[](&this->idToQCOMDecorations,&local_20);
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back(this_00,&texid);
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessingQCOMDecoration(spv::Id id, spv::Decoration decor)
{
  spv::Op opc = builder.getOpCode(id);
  if (opc == spv::OpSampledImage) {
    id  = builder.getIdOperand(id, 0);
    opc = builder.getOpCode(id);
  }

  if (opc == spv::OpLoad) {
    spv::Id texid = builder.getIdOperand(id, 0);
    if (!hasQCOMImageProceessingDecoration(texid, decor)) {//
      builder.addDecoration(texid, decor);
      idToQCOMDecorations[texid].push_back(decor);
    }
  }
}